

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientService.cpp
# Opt level: O0

bool __thiscall ClientService::startService(ClientService *this)

{
  code *pcVar1;
  int iVar2;
  byte *buffer;
  sockaddr_in serverDetails;
  byte *header;
  sockaddr_in severSettings;
  ClientService *this_local;
  
  serverDetails = ClientSocketUDP::setupServer(this->clientSocketUDP);
  buffer = initRequest(this,this->data);
  iVar2 = ClientSocketUDP::getSocket(this->clientSocketUDP);
  sendPacket(this,buffer,iVar2,serverDetails);
  iVar2 = ClientSocketUDP::getSocket(this->clientSocketUDP);
  receiveResponse(this,iVar2,serverDetails,(long)this->windowSize,0,0);
  free(buffer);
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

bool ClientService::startService() {
    struct sockaddr_in severSettings;
    severSettings = clientSocketUDP->setupServer();
    byte *header = initRequest(data);
    sendPacket(header, clientSocketUDP->getSocket(), severSettings);
    receiveResponse(clientSocketUDP->getSocket(), severSettings, windowSize);
    free(header);
}